

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptGenerator.cpp
# Opt level: O1

JavascriptGenerator *
Js::JavascriptGenerator::New
          (Recycler *recycler,DynamicType *generatorType,Arguments *args,
          ScriptFunction *scriptFunction)

{
  Type address;
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  Recycler *pRVar4;
  undefined4 *puVar5;
  void **dst;
  JavascriptGenerator *this;
  ulong uVar6;
  undefined1 local_78 [8];
  TrackAllocData data;
  Arguments heapArgs;
  
  data.plusSize = (ulong)args->Info & 0xffffff;
  if (data.plusSize != 0) {
    local_78 = (undefined1  [8])&Memory::WriteBarrierPtr<void>::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.count = (size_t)anon_var_dwarf_7444f7c;
    data.filename._0_4_ = 0x4e;
    pRVar4 = Memory::Recycler::TrackAllocInfo(recycler,(TrackAllocData *)local_78);
    uVar6 = (ulong)args->Info & 0xffffff;
    if (uVar6 == 0) {
      Memory::Recycler::ClearTrackAllocInfo(pRVar4,(TrackAllocData *)0x0);
      dst = (void **)&DAT_00000008;
    }
    else {
      BVar3 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar3 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                    ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                    "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar2) goto LAB_00bdc3b0;
        *puVar5 = 0;
      }
      uVar6 = (ulong)(uint)((int)uVar6 << 3);
      dst = (void **)Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)256,false>
                               (pRVar4,uVar6);
      if (dst == (void **)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                    ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
        if (!bVar2) {
LAB_00bdc3b0:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar5 = 0;
      }
      memset(dst,0,uVar6);
    }
    uVar6 = (ulong)(SUB84(args->Info,0) & 0xffffff);
    Memory::CopyArray<void*,Memory::WriteBarrierPtr<void>,Memory::Recycler>
              (dst,uVar6,args->Values,uVar6);
  }
  data._32_8_ = args->Info;
  if (DAT_015d641e == '\x01') {
    local_78 = (undefined1  [8])&typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_7444f7c;
    data.filename._0_4_ = 0x5c;
    pRVar4 = Memory::Recycler::TrackAllocInfo(recycler,(TrackAllocData *)local_78);
    this = (JavascriptGenerator *)new<Memory::Recycler>(0x60,pRVar4,0x3a2aea);
    JavascriptGenerator(this,generatorType,(Arguments *)&data.line,scriptFunction);
    address = (this->args).Values;
    if (address != (Type)0x0) {
      Memory::Recycler::RegisterPendingWriteBarrierBlock
                (recycler,address,(ulong)((*(uint *)&(this->args).Info & 0xffffff) << 3));
      Memory::Recycler::RegisterPendingWriteBarrierBlock(recycler,&(this->args).Values,8);
    }
  }
  else {
    local_78 = (undefined1  [8])&typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_7444f7c;
    data.filename._0_4_ = 0x6d;
    pRVar4 = Memory::Recycler::TrackAllocInfo(recycler,(TrackAllocData *)local_78);
    this = (JavascriptGenerator *)new<Memory::Recycler>(0x60,pRVar4,0x38bbb2);
    JavascriptGenerator(this,generatorType,(Arguments *)&data.line,scriptFunction);
  }
  return this;
}

Assistant:

JavascriptGenerator* JavascriptGenerator::New(
    Recycler* recycler,
    DynamicType* generatorType,
    Arguments& args,
    ScriptFunction* scriptFunction)
{
    // InterpreterStackFrame takes a pointer to the args, so copy them to the recycler
    // heap and use that buffer for the generator's InterpreterStackFrame
    Field(Var)* argValuesCopy = nullptr;

    if (args.Info.Count > 0)
    {
        argValuesCopy = RecyclerNewArray(recycler, Field(Var), args.Info.Count);
        CopyArray(argValuesCopy, args.Info.Count, args.Values, args.Info.Count);
    }

    Arguments heapArgs(args.Info, unsafe_write_barrier_cast<Var*>(argValuesCopy));

#if GLOBAL_ENABLE_WRITE_BARRIER
    if (CONFIG_FLAG(ForceSoftwareWriteBarrier))
    {
        JavascriptGenerator* obj = RecyclerNewFinalized(
            recycler,
            JavascriptGenerator,
            generatorType,
            heapArgs,
            scriptFunction);

        if (obj->args.Values != nullptr)
        {
            recycler->RegisterPendingWriteBarrierBlock(
                obj->args.Values,
                obj->args.Info.Count * sizeof(Var));

            recycler->RegisterPendingWriteBarrierBlock(
                &obj->args.Values,
                sizeof(Var*));
        }

        return obj;
    }
#endif

    return RecyclerNew(recycler, JavascriptGenerator, generatorType, heapArgs, scriptFunction);
}